

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

bool __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>_>::IsPolymorphic
          (ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>_> *this)

{
  ChExceptionArchive *this_00;
  allocator local_31;
  string local_30;
  ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>_> *local_10;
  ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>_> *this_local;
  
  local_10 = this;
  this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_30,"Cannot call IsPolymorphic() for a constructed object.",&local_31);
  ChExceptionArchive::ChExceptionArchive(this_00,&local_30);
  __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChExceptionArchive::~ChExceptionArchive);
}

Assistant:

virtual bool IsPolymorphic() 
        { throw (ChExceptionArchive( "Cannot call IsPolymorphic() for a constructed object.")); }